

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCurl.cxx
# Opt level: O2

string * cmCurlSetCAInfo_abi_cxx11_(string *__return_storage_ptr__,CURL *curl,char *cafile)

{
  bool bVar1;
  CURLcode CVar2;
  allocator local_39;
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((cafile == (char *)0x0) || (*cafile == '\0')) {
    bVar1 = cmsys::SystemTools::FileExists("/etc/pki/tls/certs/ca-bundle.crt",true);
    if (bVar1) {
      CVar2 = curl_easy_setopt(curl,CURLOPT_CAINFO,"/etc/pki/tls/certs/ca-bundle.crt");
      if (CVar2 != CURLE_OK) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        curl_easy_strerror(CVar2);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    else {
      bVar1 = cmsys::SystemTools::FileExists("/etc/ssl/certs/ca-certificates.crt",true);
      if ((bVar1) &&
         (CVar2 = curl_easy_setopt(curl,CURLOPT_CAINFO,"/etc/ssl/certs/ca-certificates.crt"),
         CVar2 != CURLE_OK)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        curl_easy_strerror(CVar2);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::string((string *)&local_38,"/etc/ssl/certs",&local_39);
      bVar1 = cmsys::SystemTools::FileIsDirectory(&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      if ((bVar1) &&
         (CVar2 = curl_easy_setopt(curl,CURLOPT_CAPATH,"/etc/ssl/certs"), CVar2 != CURLE_OK)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        curl_easy_strerror(CVar2);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  else {
    CVar2 = curl_easy_setopt(curl,CURLOPT_CAINFO);
    if (CVar2 != CURLE_OK) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      curl_easy_strerror(CVar2);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCurlSetCAInfo(::CURL *curl, const char* cafile)
{
  std::string e;
  if(cafile && *cafile)
    {
    ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_CAINFO, cafile);
    check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
    }
#if !defined(CMAKE_USE_SYSTEM_CURL) && \
    !defined(_WIN32) && !defined(__APPLE__) && \
    !defined(CURL_CA_BUNDLE) && !defined(CURL_CA_PATH)
# define CMAKE_CAFILE_FEDORA "/etc/pki/tls/certs/ca-bundle.crt"
  else if(cmSystemTools::FileExists(CMAKE_CAFILE_FEDORA, true))
    {
    ::CURLcode res =
      ::curl_easy_setopt(curl, CURLOPT_CAINFO, CMAKE_CAFILE_FEDORA);
    check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
    }
# undef CMAKE_CAFILE_FEDORA
  else
    {
#   define CMAKE_CAFILE_COMMON "/etc/ssl/certs/ca-certificates.crt"
    if(cmSystemTools::FileExists(CMAKE_CAFILE_COMMON, true))
      {
      ::CURLcode res =
        ::curl_easy_setopt(curl, CURLOPT_CAINFO, CMAKE_CAFILE_COMMON);
      check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
      }
#   undef CMAKE_CAFILE_COMMON
#   define CMAKE_CAPATH_COMMON "/etc/ssl/certs"
    if(cmSystemTools::FileIsDirectory(CMAKE_CAPATH_COMMON))
      {
      ::CURLcode res =
        ::curl_easy_setopt(curl, CURLOPT_CAPATH, CMAKE_CAPATH_COMMON);
      check_curl_result(res, "Unable to set TLS/SSL Verify CAPATH: ");
      }
#   undef CMAKE_CAPATH_COMMON
    }
#endif
  return e;
}